

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_311f33::Handlers::beginPages(Handlers *this,JSON *j)

{
  bool bVar1;
  element_type *this_00;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68 [32];
  JSON local_48;
  undefined1 local_38 [8];
  string file;
  JSON *j_local;
  Handlers *this_local;
  
  file.field_2._8_8_ = j;
  std::__cxx11::string::string((string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"file",&local_69);
  JSON::getDictItem(&local_48,(string *)j);
  bVar1 = JSON::getString(&local_48,(string *)local_38);
  JSON::~JSON(&local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    QTC::TC("qpdf","QPDFJob json pages no file",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"file is required in page specification",&local_a1);
    usage(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  this_00 = std::__shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->c_pages);
  QPDFJob::PagesConfig::file(this_00,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
Handlers::beginPages(JSON j)
{
    std::string file;
    if (!j.getDictItem("file").getString(file)) {
        QTC::TC("qpdf", "QPDFJob json pages no file");
        usage("file is required in page specification");
    }
    c_pages->file(file);
}